

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defopcode.c
# Opt level: O3

void replace_dollar_number_with_list(List *code,int field,List *list)

{
  ListStruct *pLVar1;
  anon_union_8_7_0ba269be_for_u aVar2;
  char *pcVar3;
  unsigned_long uVar4;
  TokenType TVar5;
  undefined4 uVar6;
  List *pLVar7;
  ListStruct *pLVar8;
  
  if (code != (List *)0x0) {
    do {
      if (((code->token).type == TOK_DOLLAR_NUMBER) &&
         ((uint)(code->token).u.reginfo.which == field)) {
        pLVar7 = copy_list(list);
        pLVar8 = code->cdr;
        pLVar1 = pLVar7->car;
        TVar5 = (pLVar7->token).type;
        uVar6 = *(undefined4 *)&(pLVar7->token).field_0x4;
        aVar2 = (pLVar7->token).u;
        pcVar3 = (pLVar7->token).filename;
        uVar4 = (pLVar7->token).lineno;
        code->cdr = pLVar7->cdr;
        code->car = pLVar1;
        (code->token).type = TVar5;
        *(undefined4 *)&(code->token).field_0x4 = uVar6;
        (code->token).u = aVar2;
        (code->token).filename = pcVar3;
        (code->token).lineno = uVar4;
        code->cdr = pLVar8;
      }
      else {
        replace_dollar_number_with_list(code->car,field,list);
        pLVar8 = code->cdr;
      }
      code = pLVar8;
    } while (pLVar8 != (ListStruct *)0x0);
  }
  return;
}

Assistant:

static void
replace_dollar_number_with_list (List *code, int field, List *list)
{
  if (code == NULL)
    return;

  if (code->token.type == TOK_DOLLAR_NUMBER
      && code->token.u.dollarinfo.which == field)
    {
      List *new = copy_list (list);
      List *old_cdr = code->cdr;

      *code = *new;
      code->cdr = old_cdr;
    }
  else
    replace_dollar_number_with_list (code->car, field, list);
  replace_dollar_number_with_list (code->cdr, field, list);
}